

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t match_owner_id(id_array *ids,int64_t id)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar2 = (uint)ids->count;
  while( true ) {
    uVar1 = uVar2;
    if (uVar1 <= uVar3) {
      return L'\0';
    }
    uVar2 = uVar3 + uVar1 >> 1;
    if (ids->ids[uVar2] == id) break;
    if (ids->ids[uVar2] < id) {
      uVar3 = uVar2 + 1;
      uVar2 = uVar1;
    }
  }
  return L'\x01';
}

Assistant:

static int
match_owner_id(struct id_array *ids, int64_t id)
{
	unsigned b, m, t;

	t = 0;
	b = (unsigned)ids->count;
	while (t < b) {
		m = (t + b)>>1;
		if (ids->ids[m] == id)
			return (1);
		if (ids->ids[m] < id)
			t = m + 1;
		else
			b = m;
	}
	return (0);
}